

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void icu_63::UnicodeSet::_appendToPat(UnicodeString *buf,UnicodeString *s,UBool escapeUnprintable)

{
  short sVar1;
  int iVar2;
  uint c;
  int32_t offset;
  
  offset = 0;
  while( true ) {
    sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (iVar2 <= offset) break;
    c = UnicodeString::char32At(s,offset);
    _appendToPat(buf,c,escapeUnprintable);
    offset = (offset - (uint)(c < 0x10000)) + 2;
  }
  return;
}

Assistant:

void UnicodeSet::_appendToPat(UnicodeString& buf, const UnicodeString& s, UBool
escapeUnprintable) {
    UChar32 cp;
    for (int32_t i = 0; i < s.length(); i += U16_LENGTH(cp)) {
        _appendToPat(buf, cp = s.char32At(i), escapeUnprintable);
    }
}